

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getrands.cpp
# Opt level: O2

void __thiscall getRands::userandfile(getRands *this)

{
  uint uVar1;
  FILE *__stream;
  ulong uVar2;
  OASIS_FLOAT *__ptr;
  size_t sVar3;
  
  __stream = fopen("static/random.bin","rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"FATAL: %s: Error opening file %s\n","userandfile","static/random.bin");
  }
  else {
    fseek(__stream,0,2);
    uVar2 = ftell(__stream);
    this->buffersize_ = (uint)(uVar2 >> 2);
    fseek(__stream,0,0);
    uVar1 = this->buffersize_;
    __ptr = (OASIS_FLOAT *)operator_new__((ulong)uVar1 * 4);
    this->buf_ = __ptr;
    sVar3 = fread(__ptr,4,(ulong)uVar1,__stream);
    if (sVar3 == this->buffersize_) {
      fclose(__stream);
      return;
    }
    fprintf(_stderr,"FATAL: %s: Error reading random number file\n","userandfile");
  }
  exit(-1);
}

Assistant:

void getRands::userandfile()
{
	FILE *fin = fopen(RANDOM_FILE, "rb");
	if (fin == NULL) {
		fprintf(stderr, "FATAL: %s: Error opening file %s\n", __func__, RANDOM_FILE);
		exit(-1);
	}
	flseek(fin, 0L, SEEK_END);
	long long p = fltell(fin);
	buffersize_ = p / sizeof(OASIS_FLOAT);
	//		_buffersize = _buffersize - 1;		// first 4 bytes is the limit
	fseek(fin, 0L, SEEK_SET);

	buf_ = new OASIS_FLOAT[buffersize_];
	if (fread(buf_, sizeof(OASIS_FLOAT), buffersize_, fin) != buffersize_) {
		fprintf(stderr, "FATAL: %s: Error reading random number file\n", __func__);
		exit(-1);
	}
	fclose(fin);
}